

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2FullMatchWithNoArgs(void)

{
  bool bVar1;
  StringPiece local_1a8;
  LogMessage local_198;
  
  RE2::RE2((RE2 *)&local_198,"h");
  local_1a8.ptr_ = "h";
  local_1a8.length_ = 1;
  bVar1 = RE2::FullMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x241,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::FullMatch(\"h\", \"h\")",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"hello");
  local_1a8.ptr_ = "hello";
  local_1a8.length_ = 5;
  bVar1 = RE2::FullMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x242,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::FullMatch(\"hello\", \"hello\")",0x2e)
    ;
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"h.*o");
  local_1a8.ptr_ = "hello";
  local_1a8.length_ = 5;
  bVar1 = RE2::FullMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x243,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::FullMatch(\"hello\", \"h.*o\")",0x2d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"h.*o");
  local_1a8.ptr_ = "othello";
  local_1a8.length_ = 7;
  bVar1 = RE2::FullMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x244,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: !RE2::FullMatch(\"othello\", \"h.*o\")",
               0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"h.*o");
  local_1a8.ptr_ = "hello!";
  local_1a8.length_ = 6;
  bVar1 = RE2::FullMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x245,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: !RE2::FullMatch(\"hello!\", \"h.*o\")",0x2f
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchWithNoArgs) {
  CHECK(RE2::FullMatch("h", "h"));
  CHECK(RE2::FullMatch("hello", "hello"));
  CHECK(RE2::FullMatch("hello", "h.*o"));
  CHECK(!RE2::FullMatch("othello", "h.*o"));       // Must be anchored at front
  CHECK(!RE2::FullMatch("hello!", "h.*o"));        // Must be anchored at end
}